

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O1

QDataStream * operator>>(QDataStream *in,QHostAddress *address)

{
  int i;
  long lVar1;
  long in_FS_OFFSET;
  quint32 ipv4;
  qint8 prot;
  QString local_58;
  byte local_39;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_39 = 0xaa;
  QDataStream::operator>>(in,&local_39);
  if (local_39 < 2) {
    if (local_39 == 0) {
      local_58.d.d = (Data *)CONCAT44(local_58.d.d._4_4_,0xaaaaaaaa);
      QDataStream::operator>>(in,(int *)&local_58);
      QHostAddress::setAddress(address,(quint32)local_58.d.d);
      goto LAB_001aed11;
    }
    if (local_39 == 1) {
      local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      lVar1 = 0;
      do {
        QDataStream::operator>>(in,local_38 + lVar1);
        lVar1 = lVar1 + 1;
      } while (lVar1 != 0x10);
      QHostAddress::setAddress(address,(Q_IPV6ADDR *)local_38);
      local_58.d.d = (Data *)0x0;
      local_58.d.ptr = (char16_t *)0x0;
      local_58.d.size = 0;
      operator>>(in,(QString *)&local_58);
      QHostAddress::setScopeId(address,&local_58);
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
      goto LAB_001aed11;
    }
  }
  else {
    if (local_39 == 2) {
      QHostAddress::clear(address);
      ((address->d).d.ptr)->protocol = '\x02';
      goto LAB_001aed11;
    }
    if (local_39 == 0xff) {
      QHostAddress::clear(address);
      goto LAB_001aed11;
    }
  }
  QHostAddress::clear(address);
  QDataStream::setStatus((Status)in);
LAB_001aed11:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return in;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator>>(QDataStream &in, QHostAddress &address)
{
    qint8 prot;
    in >> prot;
    switch (QHostAddress::NetworkLayerProtocol(prot)) {
    case QHostAddress::UnknownNetworkLayerProtocol:
        address.clear();
        break;
    case QHostAddress::IPv4Protocol:
    {
        quint32 ipv4;
        in >> ipv4;
        address.setAddress(ipv4);
    }
        break;
    case QHostAddress::IPv6Protocol:
    {
        Q_IPV6ADDR ipv6;
        for (int i = 0; i < 16; ++i)
            in >> ipv6[i];
        address.setAddress(ipv6);

        QString scope;
        in >> scope;
        address.setScopeId(scope);
    }
        break;
    case QHostAddress::AnyIPProtocol:
        address = QHostAddress::Any;
        break;
    default:
        address.clear();
        in.setStatus(QDataStream::ReadCorruptData);
    }
    return in;
}